

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

uint64 crnlib::dxt_fast::determine_error
                 (uint n,color_quad_u8 *block,uint min16,uint max16,uint64 early_out_error)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  color_quad<unsigned_char,_int> *this;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *this_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint in_EDI;
  ulong in_R8;
  int e;
  color_quad_u8 *b;
  int dot;
  uint s;
  color_quad_u8 *a;
  uint i_1;
  uint64 total_error;
  int c3Point;
  int halfPoint;
  int c0Point;
  int i;
  int stops [4];
  int dirb;
  int dirg;
  int dirr;
  color_quad_u8 color [4];
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_a0;
  uint local_84;
  uint local_74;
  ulong local_70;
  int local_5c;
  int local_58 [5];
  int local_44;
  int local_40;
  int local_3c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_38;
  byte local_34;
  byte local_33;
  byte local_32;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aaStack_28 [2];
  ulong local_20;
  int local_18;
  int local_14;
  long local_10;
  uint local_4;
  
  local_a0 = &local_38;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&local_a0->field_0)
    ;
    local_a0 = local_a0 + 1;
  } while (local_a0 != aaStack_28);
  eval_colors((color_quad_u8 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  local_3c = (uint)local_38.field_0.r - (uint)local_34;
  local_40 = (uint)local_38.field_0.g - (uint)local_33;
  local_44 = (uint)local_38.field_0.b - (uint)local_32;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    local_58[local_5c] =
         (uint)local_38.c[(long)local_5c * 4] * local_3c +
         (uint)local_38.c[(long)local_5c * 4 + 1] * local_40 +
         (uint)local_38.c[(long)local_5c * 4 + 2] * local_44;
  }
  local_70 = 0;
  local_74 = 0;
  while( true ) {
    if (local_4 <= local_74) {
      return local_70;
    }
    this = (color_quad<unsigned_char,_int> *)(local_10 + (ulong)local_74 * 4);
    local_84 = 0;
    if (local_14 != local_18) {
      iVar6 = (uint)(this->field_0).field_0.r * local_3c +
              (uint)(this->field_0).field_0.g * local_40 +
              (uint)(this->field_0).field_0.b * local_44;
      if (iVar6 < local_58[3] + local_58[2] >> 1) {
        local_84 = 3;
        if (iVar6 < local_58[1] + local_58[3] >> 1) {
          local_84 = 1;
        }
      }
      else {
        local_84 = 0;
        if (iVar6 < local_58[2] + local_58[0] >> 1) {
          local_84 = 2;
        }
      }
    }
    this_00 = &local_38 + local_84;
    bVar1 = color_quad<unsigned_char,_int>::operator[](this,0);
    uVar7 = (uint)bVar1;
    bVar1 = color_quad<unsigned_char,_int>::operator[]
                      ((color_quad<unsigned_char,_int> *)&this_00->field_0,0);
    bVar2 = color_quad<unsigned_char,_int>::operator[](this,1);
    bVar3 = color_quad<unsigned_char,_int>::operator[]
                      ((color_quad<unsigned_char,_int> *)&this_00->field_0,1);
    bVar4 = color_quad<unsigned_char,_int>::operator[](this,2);
    bVar5 = color_quad<unsigned_char,_int>::operator[]
                      ((color_quad<unsigned_char,_int> *)&this_00->field_0,2);
    local_70 = (long)(int)(((uint)bVar4 - (uint)bVar5) * ((uint)bVar4 - (uint)bVar5)) +
               (long)(int)(((uint)bVar2 - (uint)bVar3) * ((uint)bVar2 - (uint)bVar3)) +
               (long)(int)((uVar7 - bVar1) * (uVar7 - bVar1)) + local_70;
    if (local_20 <= local_70) break;
    local_74 = local_74 + 1;
  }
  return local_70;
}

Assistant:

static uint64 determine_error(uint n, const color_quad_u8* block, uint min16, uint max16, uint64 early_out_error) {
  color_quad_u8 color[4];

  eval_colors(color, min16, max16);

  int dirr = color[0].r - color[1].r;
  int dirg = color[0].g - color[1].g;
  int dirb = color[0].b - color[1].b;

  int stops[4];
  for (int i = 0; i < 4; i++)
    stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;

  // 0 2 3 1
  int c0Point = stops[1] + stops[3];
  int halfPoint = stops[3] + stops[2];
  int c3Point = stops[2] + stops[0];

  c0Point >>= 1;
  halfPoint >>= 1;
  c3Point >>= 1;

  uint64 total_error = 0;

  for (uint i = 0; i < n; i++) {
    const color_quad_u8& a = block[i];

    uint s = 0;
    if (min16 != max16) {
      int dot = a.r * dirr + a.g * dirg + a.b * dirb;

      if (dot < halfPoint)
        s = (dot < c0Point) ? 1 : 3;
      else
        s = (dot < c3Point) ? 2 : 0;
    }

    const color_quad_u8& b = color[s];

    int e = a[0] - b[0];
    total_error += e * e;

    e = a[1] - b[1];
    total_error += e * e;

    e = a[2] - b[2];
    total_error += e * e;

    if (total_error >= early_out_error)
      break;
  }

  return total_error;
}